

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderIsolines.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShadersIsolines::countIsolines
          (TessellationShadersIsolines *this,_test_result *test_result)

{
  uint uVar1;
  float *found_y;
  float *pfVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  vector<float,_std::allocator<float>_> found_ys;
  float vertex_y;
  float *local_48;
  iterator iStack_40;
  float *local_38;
  float local_24;
  
  local_48 = (float *)0x0;
  iStack_40._M_current = (float *)0x0;
  local_38 = (float *)0x0;
  uVar1 = test_result->n_vertices;
  if (uVar1 == 0) {
    test_result->n_isolines = 0;
  }
  else {
    uVar3 = 0;
    do {
      local_24 = (test_result->rendered_data).super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_start[(ulong)(uint)((int)uVar3 * 3) + 1];
      for (pfVar2 = local_48; pfVar2 != iStack_40._M_current; pfVar2 = pfVar2 + 1) {
        fVar4 = local_24 - *pfVar2;
        fVar5 = -fVar4;
        if (-fVar4 <= fVar4) {
          fVar5 = fVar4;
        }
        if (fVar5 < 1e-05) goto LAB_00d27a6a;
      }
      if (iStack_40._M_current == local_38) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&local_48,iStack_40,&local_24);
        uVar1 = test_result->n_vertices;
      }
      else {
        *iStack_40._M_current = local_24;
        iStack_40._M_current = iStack_40._M_current + 1;
      }
LAB_00d27a6a:
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar1);
    test_result->n_isolines = (uint)((ulong)((long)iStack_40._M_current - (long)local_48) >> 2);
    if (local_48 != (float *)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
  }
  return;
}

Assistant:

void TessellationShadersIsolines::countIsolines(_test_result& test_result)
{
	const float		   epsilon = 1e-5f;
	std::vector<float> found_ys;

	for (unsigned int n_vertex = 0; n_vertex < test_result.n_vertices; ++n_vertex)
	{
		bool		 was_y_found = false;
		const float* vertex		 = (&test_result.rendered_data[0]) + n_vertex * 3; /* components */
		float		 vertex_y	= vertex[1];

		for (std::vector<float>::iterator found_ys_iterator = found_ys.begin(); found_ys_iterator != found_ys.end();
			 found_ys_iterator++)
		{
			float& found_y = *found_ys_iterator;

			if (de::abs(vertex_y - found_y) < epsilon)
			{
				was_y_found = true;

				break;
			}
		} /* for (all found Ys) */

		if (!was_y_found)
		{
			found_ys.push_back(vertex_y);
		}
	} /* for (all vertices) */

	/* Store the value */
	test_result.n_isolines = (unsigned int)found_ys.size();
}